

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.cpp
# Opt level: O3

void KMPAffinity::pick_api(void)

{
  if (!picked_api) {
    __kmp_affinity_dispatch = (KMPAffinity *)___kmp_allocate(8);
    __kmp_affinity_dispatch->_vptr_KMPAffinity = (_func_int **)&PTR__KMPAffinity_00197bc0;
    picked_api = true;
  }
  return;
}

Assistant:

void KMPAffinity::pick_api() {
  KMPAffinity *affinity_dispatch;
  if (picked_api)
    return;
#if KMP_USE_HWLOC
  // Only use Hwloc if affinity isn't explicitly disabled and
  // user requests Hwloc topology method
  if (__kmp_affinity_top_method == affinity_top_method_hwloc &&
      __kmp_affinity_type != affinity_disabled) {
    affinity_dispatch = new KMPHwlocAffinity();
  } else
#endif
  {
    affinity_dispatch = new KMPNativeAffinity();
  }
  __kmp_affinity_dispatch = affinity_dispatch;
  picked_api = true;
}